

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void irafswap2(char *string,int nbytes)

{
  char cVar1;
  char *slast;
  char temp;
  char *sbyte;
  int nbytes_local;
  char *string_local;
  
  for (sbyte = string; sbyte < string + nbytes; sbyte = sbyte + 2) {
    cVar1 = *sbyte;
    *sbyte = sbyte[1];
    sbyte[1] = cVar1;
  }
  return;
}

Assistant:

static void irafswap2 (

char *string,	/* Address of starting point of bytes to swap */
int nbytes)	/* Number of bytes to swap */

{
    char *sbyte, temp, *slast;

    slast = string + nbytes;
    sbyte = string;
    while (sbyte < slast) {
	temp = sbyte[0];
	sbyte[0] = sbyte[1];
	sbyte[1] = temp;
	sbyte= sbyte + 2;
	}
    return;
}